

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O0

result_t *
ising::free_energy::square::transfer_matrix<double>::calc
          (uint_t Lx,uint_t Ly,real_t Jx,real_t Jy,real_t beta,real_t h)

{
  invalid_argument *piVar1;
  vector<double,_std::allocator<double>_> *diag_10_00;
  reference pvVar2;
  long in_RDX;
  ulong in_RSI;
  exp_number *in_RDI;
  double dVar3;
  value_type vVar4;
  undefined1 auVar5 [16];
  double in_XMM2_Qa;
  uint_t x;
  uint_t j;
  exp_number factor;
  uint_t i;
  vector<double,_std::allocator<double>_> vt;
  vector<double,_std::allocator<double>_> v_02;
  vector<double,_std::allocator<double>_> v_01;
  vector<double,_std::allocator<double>_> v_20;
  vector<double,_std::allocator<double>_> v_10;
  vector<double,_std::allocator<double>_> v;
  exp_number sum_02;
  exp_number sum_01;
  exp_number sum_20;
  exp_number sum_10;
  exp_number sum;
  vector<double,_std::allocator<double>_> diag_02;
  vector<double,_std::allocator<double>_> diag_01;
  vector<double,_std::allocator<double>_> diag_20;
  vector<double,_std::allocator<double>_> diag_10;
  vector<double,_std::allocator<double>_> diag;
  uint_t dim;
  exp_number<double> *in_stack_fffffffffffffaa8;
  exp_number<double> *in_stack_fffffffffffffab0;
  exp_number<double> *in_stack_fffffffffffffab8;
  allocator_type *in_stack_fffffffffffffac0;
  size_type in_stack_fffffffffffffac8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffad0;
  exp_number<double> *in_stack_fffffffffffffad8;
  exp_number<double> *in_stack_fffffffffffffae0;
  vector<double,_std::allocator<double>_> *diag_02_00;
  vector<double,_std::allocator<double>_> *diag_01_00;
  vector<double,_std::allocator<double>_> *diag_20_00;
  vector<double,_std::allocator<double>_> *diag_10_01;
  vector<double,_std::allocator<double>_> *diag_21;
  vector<double,_std::allocator<double>_> *diag_02_01;
  vector<double,_std::allocator<double>_> *diag_01_01;
  vector<double,_std::allocator<double>_> *diag_20_01;
  vector<double,_std::allocator<double>_> *diag_22;
  exp_number *v_21;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffca8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb8;
  exp_number *in_stack_fffffffffffffcc0;
  real_t in_stack_fffffffffffffcc8;
  real_t in_stack_fffffffffffffcd0;
  uint_t in_stack_fffffffffffffcd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcf0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcf8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd00;
  exp_number<double> local_260 [2];
  exp_number<double> local_240;
  value_type local_230;
  int32_t local_228;
  ulong local_220;
  vector<double,_std::allocator<double>_> *local_218;
  self_ local_210;
  vector<double,_std::allocator<double>_> *local_200;
  exp_number<double> local_1f0 [2];
  vector<double,_std::allocator<double>_> local_1d0;
  vector<double,_std::allocator<double>_> local_1b0;
  vector<double,_std::allocator<double>_> local_190;
  vector<double,_std::allocator<double>_> local_170;
  vector<double,_std::allocator<double>_> local_150 [4];
  vector<double,_std::allocator<double>_> local_e1;
  vector<double,_std::allocator<double>_> local_c1;
  vector<double,_std::allocator<double>_> local_a1;
  vector<double,_std::allocator<double>_> local_81;
  vector<double,_std::allocator<double>_> local_61;
  vector<double,_std::allocator<double>_> *local_48;
  double local_28;
  long local_10;
  ulong local_8;
  
  if ((in_RSI != 0) && (in_RDX != 0)) {
    if (in_XMM2_Qa <= 0.0) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"beta should be positive");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_10._0_1_ = (byte)in_RDX;
    diag_10_00 = (vector<double,_std::allocator<double>_> *)(long)(1 << ((byte)local_10 & 0x1f));
    diag_22 = &local_61;
    v_21 = in_RDI;
    local_48 = diag_10_00;
    local_28 = in_XMM2_Qa;
    local_10 = in_RDX;
    local_8 = in_RSI;
    std::allocator<double>::allocator((allocator<double> *)0x10b91a);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10b946);
    diag_20_01 = &local_81;
    diag_01_01 = local_48;
    std::allocator<double>::allocator((allocator<double> *)0x10b96b);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10b997);
    diag_02_01 = &local_a1;
    diag_21 = local_48;
    std::allocator<double>::allocator((allocator<double> *)0x10b9bc);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10b9e8);
    diag_10_01 = &local_c1;
    diag_20_00 = local_48;
    std::allocator<double>::allocator((allocator<double> *)0x10ba0d);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10ba39);
    diag_01_00 = &local_e1;
    diag_02_00 = local_48;
    std::allocator<double>::allocator((allocator<double> *)0x10ba5e);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10ba8a);
    fill_D((uint_t)diag_10_00,(real_t)diag_20_01,(real_t)diag_01_01,(real_t)diag_02_01,diag_21,
           diag_10_01,diag_20_00,diag_01_00,diag_02_00);
    standards::exp_number<double>::exp_number
              (in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
    standards::exp_number<double>::exp_number
              (in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
    standards::exp_number<double>::exp_number
              (in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
    standards::exp_number<double>::exp_number
              (in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
    standards::exp_number<double>::exp_number
              (in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
    std::allocator<double>::allocator((allocator<double> *)0x10bb5b);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10bb87);
    std::allocator<double>::allocator((allocator<double> *)0x10bbac);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10bbd8);
    std::allocator<double>::allocator((allocator<double> *)0x10bbfd);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10bc29);
    std::allocator<double>::allocator((allocator<double> *)0x10bc4e);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10bc7a);
    std::allocator<double>::allocator((allocator<double> *)0x10bc9f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10bccb);
    std::allocator<double>::allocator((allocator<double> *)0x10bcf0);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    std::allocator<double>::~allocator((allocator<double> *)0x10bd1c);
    for (local_200 = (vector<double,_std::allocator<double>_> *)0x0; local_200 < local_48;
        local_200 = (vector<double,_std::allocator<double>_> *)
                    ((long)&(local_200->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start + 1)) {
      standards::exp_number<double>::exp_number
                (in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
      for (local_218 = (vector<double,_std::allocator<double>_> *)0x0; local_218 < local_48;
          local_218 = (vector<double,_std::allocator<double>_> *)
                      ((long)&(local_218->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1)) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_150,(size_type)local_218);
        *pvVar2 = 0.0;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_170,(size_type)local_218);
        *pvVar2 = 0.0;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_190,(size_type)local_218);
        *pvVar2 = 0.0;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_1b0,(size_type)local_218);
        *pvVar2 = 0.0;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_1d0,(size_type)local_218);
        *pvVar2 = 0.0;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_150,(size_type)local_200);
      *pvVar2 = 1.0;
      for (local_220 = 0; local_220 < local_8; local_220 = local_220 + 1) {
        standards::exp_number<double>::exp_number(&local_240,&local_210);
        in_stack_fffffffffffffac0 = (allocator_type *)&local_190;
        product_D(diag_22,diag_10_00,diag_20_01,diag_01_01,diag_02_01,in_RDI,
                  (vector<double,_std::allocator<double>_> *)v_21,in_stack_fffffffffffffc10,
                  in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
        local_210.sign_ = local_228;
        local_210.log_ = local_230;
        standards::exp_number<double>::exp_number(local_260,&local_210);
        in_stack_fffffffffffffab8 = local_1f0;
        in_stack_fffffffffffffab0 = (exp_number<double> *)&local_1d0;
        in_stack_fffffffffffffaa8 = (exp_number<double> *)&local_1b0;
        product_U(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                  in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                  in_stack_fffffffffffffca8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,
                  in_stack_fffffffffffffd00);
      }
      std::vector<double,_std::allocator<double>_>::operator[](local_150,(size_type)local_200);
      standards::operator*(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
      standards::exp_number<double>::operator+=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8)
      ;
      std::vector<double,_std::allocator<double>_>::operator[](&local_170,(size_type)local_200);
      standards::operator*(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
      standards::exp_number<double>::operator+=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8)
      ;
      std::vector<double,_std::allocator<double>_>::operator[](&local_190,(size_type)local_200);
      standards::operator*(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
      standards::exp_number<double>::operator+=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8)
      ;
      std::vector<double,_std::allocator<double>_>::operator[](&local_1b0,(size_type)local_200);
      standards::operator*(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
      standards::exp_number<double>::operator+=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8)
      ;
      std::vector<double,_std::allocator<double>_>::operator[](&local_1d0,(size_type)local_200);
      standards::operator*(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
      standards::exp_number<double>::operator+=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8)
      ;
    }
    dVar3 = standards::log<double>((exp_number<double> *)0x10c372);
    local_10 = local_8 * local_10;
    auVar5._8_4_ = (int)((ulong)local_10 >> 0x20);
    auVar5._0_8_ = local_10;
    auVar5._12_4_ = 0x45300000;
    result_t::set((result_t *)in_RDI,0,0,
                  -dVar3 / (((auVar5._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) *
                           local_28));
    standards::log<double>((exp_number<double> *)0x10c3f8);
    standards::operator/<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator-((double)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator/(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
    vVar4 = standards::exp_number::operator_cast_to_double(in_stack_fffffffffffffaa8);
    result_t::set((result_t *)in_RDI,1,0,vVar4);
    standards::log<double>((exp_number<double> *)0x10c4f2);
    standards::operator/<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator/(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
    standards::operator*((int)((ulong)in_stack_fffffffffffffab8 >> 0x20),in_stack_fffffffffffffab0);
    standards::operator+((double)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator*<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator*<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator-<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator/<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator/<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator-<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator/(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
    vVar4 = standards::exp_number::operator_cast_to_double(in_stack_fffffffffffffaa8);
    result_t::set((result_t *)in_RDI,2,0,vVar4);
    standards::exp_number<double>::operator-(in_stack_fffffffffffffab8);
    standards::operator/<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator/(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
    vVar4 = standards::exp_number::operator_cast_to_double(in_stack_fffffffffffffaa8);
    result_t::set((result_t *)in_RDI,0,1,vVar4);
    standards::exp_number<double>::operator-(in_stack_fffffffffffffab8);
    standards::operator/<double,_double>(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    standards::operator/(in_stack_fffffffffffffab8,(double)in_stack_fffffffffffffab0);
    vVar4 = standards::exp_number::operator_cast_to_double(in_stack_fffffffffffffaa8);
    result_t::set((result_t *)in_RDI,0,2,vVar4);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
    return (result_t *)v_21;
  }
  piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar1,"Lx and Ly should be positive");
  __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static result_t calc(uint_t Lx, uint_t Ly, real_t Jx, real_t Jy, real_t beta,
                       real_t h) {
    if (Lx == 0 || Ly == 0)
      throw(std::invalid_argument("Lx and Ly should be positive"));
    if (beta <= 0)
      throw(std::invalid_argument("beta should be positive"));
    uint_t dim = 1 << Ly;

    std::vector<real_t> diag(dim), diag_10(dim), diag_20(dim), diag_01(dim),
        diag_02(dim);
    fill_D(Ly, Jy, beta, h, diag, diag_10, diag_20, diag_01, diag_02);

    result_t res;
    exp_number sum = 0;
    exp_number sum_10 = 0;
    exp_number sum_20 = 0;
    exp_number sum_01 = 0;
    exp_number sum_02 = 0;
    std::vector<real_t> v(dim), v_10(dim), v_20(dim), v_01(dim), v_02(dim),
        vt(dim);
    for (uint_t i = 0; i < dim; ++i) {
      exp_number factor = 1;
      for (uint_t j = 0; j < dim; ++j) {
        v[j] = 0;
        v_10[j] = 0;
        v_20[j] = 0;
        v_01[j] = 0;
        v_02[j] = 0;
      }
      v[i] = 1;
      for (uint_t x = 0; x < Lx; ++x) {
        factor = transfer_matrix<real_t>::product_D(diag, diag_10, diag_20,
                                                    diag_01, diag_02, factor, v,
                                                    v_10, v_20, v_01, v_02);
        factor = transfer_matrix<real_t>::product_U(Ly, Jx, beta, factor, v,
                                                    v_10, v_20, v_01, v_02, vt);
      }
      sum += factor * v[i];
      sum_10 += factor * v_10[i];
      sum_20 += factor * v_20[i];
      sum_01 += factor * v_01[i];
      sum_02 += factor * v_02[i];
    }
    res.set(0, 0, -log(sum) / (Lx * Ly * beta));
    res.set(1, 0, ((log(sum) / beta) - (sum_10 / sum)) / (Lx * Ly * beta));
    res.set(2, 0,
            (-(2 * log(sum) / beta / beta) + 2 * (sum_10 / sum / beta) -
             ((sum_20 * sum - sum_10 * sum_10) / sum / sum)) /
                (Lx * Ly * beta));
    res.set(0, 1, -sum_01 / sum / (Lx * Ly * beta));
    res.set(0, 2, -sum_02 / sum / (Lx * Ly * beta));
    return res;
  }